

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_dict.cc
# Opt level: O2

bool brotli::IsMatch(DictWord w,uint8_t *data,size_t max_length)

{
  byte bVar1;
  size_t sVar2;
  size_t i;
  ulong uVar3;
  size_t limit;
  byte *s1;
  bool bVar4;
  
  limit = (ulong)(uint)w & 0xff;
  if (max_length < limit) {
LAB_00181192:
    bVar4 = false;
  }
  else {
    uVar3 = (ulong)(((uint)w >> 0x10) * (int)limit + kBrotliDictionaryOffsetsByLength[limit]);
    s1 = kBrotliDictionary + uVar3;
    if (w.transform != '\0') {
      if (((uint)w >> 8 & 0xff) != 10) {
        uVar3 = 0;
        do {
          bVar4 = limit == uVar3;
          if (bVar4) {
            return bVar4;
          }
          bVar1 = s1[uVar3];
          if ((byte)(bVar1 + 0x9f) < 0x1a) {
            if ((data[uVar3] ^ bVar1) != 0x20) {
              return bVar4;
            }
          }
          else if (bVar1 != data[uVar3]) {
            return bVar4;
          }
          uVar3 = uVar3 + 1;
        } while( true );
      }
      if ((0x19 < (byte)(*s1 + 0x9f)) || ((*s1 ^ *data) != 0x20)) goto LAB_00181192;
      s1 = kBrotliDictionary + uVar3 + 1;
      data = data + 1;
      limit = (size_t)((int)limit - 1);
    }
    sVar2 = FindMatchLengthWithLimit(s1,data,limit);
    bVar4 = sVar2 == limit;
  }
  return bVar4;
}

Assistant:

inline bool IsMatch(DictWord w, const uint8_t* data, size_t max_length) {
  if (w.len > max_length) return false;
  const size_t offset = kBrotliDictionaryOffsetsByLength[w.len] + w.len * w.idx;
  const uint8_t* dict = &kBrotliDictionary[offset];
  if (w.transform == 0) {
    // Match against base dictionary word.
    return FindMatchLengthWithLimit(dict, data, w.len) == w.len;
  } else if (w.transform == 10) {
    // Match against uppercase first transform.
    // Note that there are only ASCII uppercase words in the lookup table.
    return (dict[0] >= 'a' && dict[0] <= 'z' &&
            (dict[0] ^ 32) == data[0] &&
            FindMatchLengthWithLimit(&dict[1], &data[1], w.len - 1u) ==
            w.len - 1u);
  } else {
    // Match against uppercase all transform.
    // Note that there are only ASCII uppercase words in the lookup table.
    for (size_t i = 0; i < w.len; ++i) {
      if (dict[i] >= 'a' && dict[i] <= 'z') {
        if ((dict[i] ^ 32) != data[i]) return false;
      } else {
        if (dict[i] != data[i]) return false;
      }
    }
    return true;
  }
}